

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

char * Wlc_ReduceMarkedInitStr(Wlc_Ntk_t *p,char *pInit)

{
  int iVar1;
  char *pcVar2;
  Wlc_Obj_t *p_00;
  size_t sVar3;
  int local_38;
  int local_34;
  int k;
  int nBits;
  int b;
  int i;
  Wlc_Obj_t *pObj;
  char *pInitNew;
  char *pInit_local;
  Wlc_Ntk_t *p_local;
  
  pcVar2 = Abc_UtilStrsav(pInit);
  local_34 = 0;
  local_38 = 0;
  for (nBits = 0; iVar1 = Wlc_NtkCiNum(p), nBits < iVar1; nBits = nBits + 1) {
    p_00 = Wlc_NtkCi(p,nBits);
    iVar1 = Wlc_ObjIsPi(p_00);
    if ((iVar1 == 0) && ((*(ushort *)p_00 >> 7 & 1) != 0)) {
      for (k = 0; iVar1 = Wlc_ObjRange(p_00), k < iVar1; k = k + 1) {
        pcVar2[local_38] = pcVar2[local_34 + k];
        local_38 = local_38 + 1;
      }
    }
    iVar1 = Wlc_ObjIsPi(p_00);
    if (iVar1 == 0) {
      iVar1 = Wlc_ObjRange(p_00);
      local_34 = iVar1 + local_34;
    }
  }
  pcVar2[local_38] = '\0';
  sVar3 = strlen(pInit);
  if (local_34 == (int)sVar3) {
    return pcVar2;
  }
  __assert_fail("nBits == (int)strlen(pInit)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNtk.c"
                ,0x379,"char *Wlc_ReduceMarkedInitStr(Wlc_Ntk_t *, char *)");
}

Assistant:

char * Wlc_ReduceMarkedInitStr( Wlc_Ntk_t * p, char * pInit )
{
    char * pInitNew = Abc_UtilStrsav( pInit );
    Wlc_Obj_t * pObj; int i, b, nBits = 0, k = 0;
    Wlc_NtkForEachCi( p, pObj, i )
    {
        if ( !Wlc_ObjIsPi(pObj) && pObj->Mark )
            for ( b = 0; b < Wlc_ObjRange(pObj); b++ )
                pInitNew[k++] = pInitNew[nBits+b];
        if ( !Wlc_ObjIsPi(pObj) )
            nBits += Wlc_ObjRange(pObj);
    }
    pInitNew[k] = '\0';
    assert( nBits == (int)strlen(pInit) );
    return pInitNew;
}